

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
pstore::json::details::object_matcher<pstore::exchange::import_ns::callbacks>::end_object
          (object_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser)

{
  bool bVar1;
  uint uVar2;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *puVar3;
  error_category *extraout_RDX;
  error_code err;
  
  puVar3 = exchange::import_ns::callbacks::top(&parser->callbacks_);
  uVar2 = (*((puVar3->_M_t).
             super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
             .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl)->
            _vptr_rule[0xd])();
  err._4_4_ = 0;
  err._M_value = uVar2;
  err._M_cat = extraout_RDX;
  bVar1 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
  if (bVar1) {
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
  }
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
  return;
}

Assistant:

void object_matcher<Callbacks>::end_object (parser<Callbacks> & parser) {
                this->set_error (parser, parser.callbacks ().end_object ());
                this->set_state (done_state);
            }